

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_parser.c
# Opt level: O2

MPP_RET mpp_mpg4_parser_split(Mpg4dParser ctx,MppPacket dst,MppPacket src)

{
  undefined1 *puVar1;
  RK_U32 RVar2;
  uint uVar3;
  void *pvVar4;
  size_t sVar5;
  RK_S64 v;
  undefined2 *puVar6;
  MPP_RET MVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  size_t sVar7;
  
  pvVar4 = mpp_packet_get_pos(src);
  sVar5 = mpp_packet_get_length(src);
  RVar2 = mpp_packet_get_eos(src);
  v = mpp_packet_get_pts(src);
  puVar6 = (undefined2 *)mpp_packet_get_data(dst);
  sVar7 = mpp_packet_get_length(dst);
  uVar3 = (uint)sVar7;
  if (((byte)mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","in\n","mpp_mpg4_parser_split");
  }
  uVar11 = 0;
  if (*(int *)((long)ctx + 0x30) == 0) {
    if (((sVar7 & 0xfffffffc) == 0) && ((*(uint *)((long)ctx + 0x2c) & 0xffffff) == 1)) {
      *puVar6 = 0;
      *(undefined1 *)(puVar6 + 1) = 1;
      uVar3 = 3;
    }
    uVar12 = 0;
    do {
      if ((sVar5 & 0xffffffff) == uVar12) {
        iVar10 = (int)uVar12;
        uVar12 = sVar5 & 0xffffffff;
        goto LAB_001a50fa;
      }
      uVar9 = uVar12 + uVar3;
      *(uint *)((long)ctx + 0x2c) =
           (uint)*(byte *)((long)pvVar4 + uVar12) | *(int *)((long)ctx + 0x2c) << 8;
      puVar1 = (undefined1 *)((long)pvVar4 + uVar12);
      uVar12 = uVar12 + 1;
      *(undefined1 *)((long)puVar6 + (uVar9 & 0xffffffff)) = *puVar1;
    } while (*(int *)((long)ctx + 0x2c) != 0x1b6);
    *(undefined4 *)((long)ctx + 0x30) = 1;
    mpp_packet_set_pts(dst,v);
    iVar10 = (int)uVar12;
LAB_001a50fa:
    sVar7 = (size_t)(uVar3 + iVar10);
    uVar11 = (uint)uVar12;
    if (*(int *)((long)ctx + 0x30) == 0) {
LAB_001a5146:
      MVar8 = MPP_NOK;
      goto LAB_001a5149;
    }
  }
  uVar12 = (ulong)uVar11;
  do {
    if ((sVar5 & 0xffffffff) <= uVar12) goto LAB_001a5146;
    *(uint *)((long)ctx + 0x2c) =
         (uint)*(byte *)((long)pvVar4 + uVar12) | *(int *)((long)ctx + 0x2c) << 8;
    puVar1 = (undefined1 *)((long)pvVar4 + uVar12);
    uVar12 = uVar12 + 1;
    iVar10 = (int)sVar7;
    uVar9 = sVar7 & 0xffffffff;
    sVar7 = (size_t)(iVar10 + 1);
    *(undefined1 *)((long)puVar6 + uVar9) = *puVar1;
  } while ((*(uint *)((long)ctx + 0x2c) & 0xffffff) != 1);
  sVar7 = (size_t)(iVar10 - 2);
  *(undefined4 *)((long)ctx + 0x30) = 0;
  MVar8 = MPP_OK;
LAB_001a5149:
  if ((RVar2 != 0) && ((uint)sVar5 <= (uint)uVar12)) {
    mpp_packet_set_eos(dst);
    MVar8 = MPP_OK;
  }
  mpp_packet_set_length(dst,sVar7 & 0xffffffff);
  mpp_packet_set_pos(src,(void *)((long)pvVar4 + (uVar12 & 0xffffffff)));
  if (((byte)mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","out\n","mpp_mpg4_parser_split");
  }
  return MVar8;
}

Assistant:

MPP_RET mpp_mpg4_parser_split(Mpg4dParser ctx, MppPacket dst, MppPacket src)
{
    MPP_RET ret = MPP_NOK;
    Mpg4dParserImpl *p = (Mpg4dParserImpl *)ctx;
    RK_U8 *src_buf = (RK_U8 *)mpp_packet_get_pos(src);
    RK_U32 src_len = (RK_U32)mpp_packet_get_length(src);
    RK_U32 src_eos = mpp_packet_get_eos(src);
    RK_S64 src_pts = mpp_packet_get_pts(src);
    RK_U8 *dst_buf = (RK_U8 *)mpp_packet_get_data(dst);
    RK_U32 dst_len = (RK_U32)mpp_packet_get_length(dst);
    RK_U32 src_pos = 0;

    mpg4d_dbg_func("in\n");

    // find the began of the vop
    if (!p->vop_header_found) {
        // add last startcode to the new frame data
        if ((dst_len < sizeof(p->state))
            && ((p->state & 0x00FFFFFF) == 0x000001)) {
            dst_buf[0] = 0;
            dst_buf[1] = 0;
            dst_buf[2] = 1;
            dst_len = 3;
        }
        while (src_pos < src_len) {
            p->state = (p->state << 8) | src_buf[src_pos];
            dst_buf[dst_len++] = src_buf[src_pos++];
            if (p->state == MPG4_VOP_STARTCODE) {
                p->vop_header_found = 1;
                mpp_packet_set_pts(dst, src_pts);
                break;
            }
        }
    }
    // find the end of the vop
    if (p->vop_header_found) {
        while (src_pos < src_len) {
            p->state = (p->state << 8) | src_buf[src_pos];
            dst_buf[dst_len++] = src_buf[src_pos++];
            if ((p->state & 0x00FFFFFF) == 0x000001) {
                dst_len -= 3;
                p->vop_header_found = 0;
                ret = MPP_OK; // split complete
                break;
            }
        }
    }
    // the last packet
    if (src_eos && src_pos >= src_len) {
        mpp_packet_set_eos(dst);
        ret = MPP_OK;
    }
    // reset the src and dst
    mpp_packet_set_length(dst, dst_len);
    mpp_packet_set_pos(src, src_buf + src_pos);

    mpg4d_dbg_func("out\n");

    return ret;
}